

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O3

void burst::detail::
     radix_sort_impl_bi_iteration<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*>
               (void *first,void *last,void *buffer_begin,long param_4,long param_5,long param_6)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  ulong uVar7;
  size_t __n;
  
  __n = (long)last - (long)first;
  lVar5 = (long)__n >> 3;
  lVar4 = *(long *)(param_5 + param_6 * 8);
  lVar1 = *(long *)(param_5 + 8 + param_6 * 8);
  if (lVar1 != lVar5 || lVar4 != lVar5) {
    if (lVar4 == lVar5) {
      if (last != first) {
        memmove(buffer_begin,first,__n);
      }
    }
    else if (last != first) {
      lVar4 = param_6 * 0x800 + param_4;
      pvVar6 = last;
      do {
        uVar2 = *(ulong *)((long)pvVar6 + -8);
        pvVar6 = (void *)((long)pvVar6 + -8);
        uVar7 = 0xffffffffffffffff;
        if (-1 < (long)uVar2) {
          uVar7 = 0x8000000000000000;
        }
        uVar7 = (uVar7 ^ uVar2) >> ((char)param_6 * '\b' & 0x3fU) & 0xff;
        lVar3 = *(long *)(lVar4 + uVar7 * 8);
        *(long *)(lVar4 + uVar7 * 8) = lVar3 + -1;
        *(ulong *)((long)buffer_begin + lVar3 * 8 + -8) = uVar2;
      } while (pvVar6 != first);
    }
    if (lVar1 == lVar5) {
      if (last != first) {
        memmove(first,buffer_begin,__n);
        return;
      }
    }
    else if (last != first) {
      param_4 = param_4 + (param_6 + 1) * 0x800;
      do {
        uVar2 = *(ulong *)((long)buffer_begin + (__n - 8));
        uVar7 = 0xffffffffffffffff;
        if (-1 < (long)uVar2) {
          uVar7 = 0x8000000000000000;
        }
        uVar7 = (uVar7 ^ uVar2) >> ((char)(param_6 + 1) * '\b' & 0x3fU) & 0xff;
        lVar4 = *(long *)(param_4 + uVar7 * 8);
        *(long *)(param_4 + uVar7 * 8) = lVar4 + -1;
        *(ulong *)((long)first + lVar4 * 8 + -8) = uVar2;
        __n = __n - 8;
      } while (__n != 0);
    }
  }
  return;
}

Assistant:

void
            radix_sort_impl_bi_iteration
            (
                RandomAccessIterator1 first,
                RandomAccessIterator1 last,
                RandomAccessIterator2 buffer_begin,
                Map map,
                Radix radix,
                RandomAccessIterator3 counters,
                RandomAccessIterator4 maximums,
                std::size_t radix_number
            )
        {
            using std::distance;
            const auto range_size = distance(first, last);
            const auto buffer_end = std::next(buffer_begin, range_size);

            const auto nth_is_single = maximums[radix_number] == range_size;
            const auto n1th_is_single = maximums[radix_number + 1] == range_size;

            if (nth_is_single && n1th_is_single)
            {
                return;
            }

            if (nth_is_single)
            {
                std::move(first, last, buffer_begin);
            }
            else
            {
                dispose_backward(std::make_move_iterator(first), std::make_move_iterator(last), buffer_begin, compose(nth_radix(radix_number, radix), map), std::begin(counters[radix_number]));
            }

            if (n1th_is_single)
            {
                std::move(buffer_begin, buffer_end, first);
            }
            else
            {
                dispose_backward(std::make_move_iterator(buffer_begin), std::make_move_iterator(buffer_end), first, compose(nth_radix(radix_number + 1, radix), map), std::begin(counters[radix_number + 1]));
            }
        }